

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O3

string * __thiscall
t_cpp_generator::argument_list_abi_cxx11_
          (string *__return_storage_ptr__,t_cpp_generator *this,t_struct *tstruct,bool name_params,
          bool start_comma)

{
  pointer pcVar1;
  long *plVar2;
  long *plVar3;
  bool bVar4;
  pointer pptVar5;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  long *local_c8;
  long local_c0;
  long local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  t_struct *local_80;
  t_cpp_generator *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_88 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_88;
  local_78 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  pptVar5 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar5 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar4 = !start_comma;
    local_80 = tstruct;
    do {
      if (!bVar4) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      type_name_abi_cxx11_(&local_50,local_78,(*pptVar5)->type_,false,true);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_b8 = *plVar3;
        uStack_b0 = (undefined4)plVar2[3];
        uStack_ac = *(undefined4 *)((long)plVar2 + 0x1c);
        local_c8 = &local_b8;
      }
      else {
        local_b8 = *plVar3;
        local_c8 = (long *)*plVar2;
      }
      local_c0 = plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      if (name_params) {
        local_e8 = &local_d8;
        pcVar1 = ((*pptVar5)->name_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e8,pcVar1,pcVar1 + ((*pptVar5)->name_)._M_string_length);
      }
      else {
        std::operator+(&local_70,"/* ",&(*pptVar5)->name_);
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
        local_e8 = &local_d8;
        plVar3 = plVar2 + 2;
        if ((long *)*plVar2 == plVar3) {
          local_d8 = *plVar3;
          lStack_d0 = plVar2[3];
        }
        else {
          local_d8 = *plVar3;
          local_e8 = (long *)*plVar2;
        }
        local_e0 = plVar2[1];
        *plVar2 = (long)plVar3;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
      }
      plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_e8);
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_98 = *plVar3;
        lStack_90 = plVar2[3];
        local_a8 = &local_98;
      }
      else {
        local_98 = *plVar3;
        local_a8 = (long *)*plVar2;
      }
      local_a0 = plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a8);
      if (local_a8 != &local_98) {
        operator_delete(local_a8);
      }
      if (local_e8 != &local_d8) {
        operator_delete(local_e8);
      }
      if ((!name_params) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2)) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (local_c8 != &local_b8) {
        operator_delete(local_c8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      pptVar5 = pptVar5 + 1;
      bVar4 = false;
    } while (pptVar5 !=
             (local_80->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_cpp_generator::argument_list(t_struct* tstruct, bool name_params, bool start_comma) {
  string result = "";

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;
  bool first = !start_comma;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if (first) {
      first = false;
    } else {
      result += ", ";
    }
    result += type_name((*f_iter)->get_type(), false, true) + " "
              + (name_params ? (*f_iter)->get_name() : "/* " + (*f_iter)->get_name() + " */");
  }
  return result;
}